

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

bool __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::hasBreakTarget(wasm::Name_
          (void *this,Name name)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  bool *in_RCX;
  anon_class_16_2_62e3d37a func;
  undefined1 local_39 [8];
  bool has;
  Expression *curr;
  void *pvStack_28;
  Index i;
  Fixer *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  pvStack_28 = this;
  bVar1 = SmallVector<wasm::Expression_*,_10UL>::empty
                    ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!expressionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x766,
                  "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::hasBreakTarget(Name)"
                 );
  }
  sVar2 = SmallVector<wasm::Expression_*,_10UL>::size
                    ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
  if (sVar2 < 2) {
    name_local.super_IString.str._M_str._7_1_ = false;
  }
  else {
    sVar2 = SmallVector<wasm::Expression_*,_10UL>::size
                      ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    curr._4_4_ = (int)sVar2 - 2;
    while( true ) {
      ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                          ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8),
                           (ulong)curr._4_4_);
      unique0x00012000 = *ppEVar3;
      local_39[0] = 0;
      func.has = in_RCX;
      func.name = (Name *)local_39;
      BranchUtils::
      operateOnScopeNameDefs<wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::hasBreakTarget(wasm::Name)::_lambda(wasm::Name&)_1_>
                ((BranchUtils *)unique0x00012000,(Expression *)&this_local,func);
      if ((local_39[0] & 1) != 0) break;
      if (curr._4_4_ == 0) {
        return false;
      }
      curr._4_4_ = curr._4_4_ - 1;
    }
    name_local.super_IString.str._M_str._7_1_ = true;
  }
  return name_local.super_IString.str._M_str._7_1_;
}

Assistant:

bool hasBreakTarget(Name name) {
      // The break must be on top.
      assert(!expressionStack.empty());
      if (expressionStack.size() < 2) {
        // There must be a scope for this break to be valid.
        return false;
      }
      Index i = expressionStack.size() - 2;
      while (1) {
        auto* curr = expressionStack[i];
        bool has = false;
        BranchUtils::operateOnScopeNameDefs(curr, [&](Name& def) {
          if (def == name) {
            has = true;
          }
        });
        if (has) {
          return true;
        }
        if (i == 0) {
          return false;
        }
        i--;
      }
    }